

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O1

SQBool sqstd_rex_searchrange
                 (SQRex *exp,SQChar *text_begin,SQChar *text_end,SQChar **out_begin,SQChar **out_end
                 )

{
  long lVar1;
  SQChar *pSVar2;
  SQBool SVar3;
  SQChar *str;
  SQChar *pSVar4;
  
  if (text_end <= text_begin) {
    return 0;
  }
  lVar1 = exp->_first;
  exp->_bol = text_begin;
  exp->_eol = text_end;
  pSVar2 = text_begin;
joined_r0x001383d6:
  do {
    pSVar4 = pSVar2;
    str = text_begin;
    if (lVar1 != -1) {
      exp->_currsubexp = 0;
      text_begin = sqstd_rex_matchnode(exp,exp->_nodes + lVar1,str,(SQRexNode *)0x0);
      str = (SQChar *)0x0;
      if (text_begin != (SQChar *)0x0) {
        lVar1 = exp->_nodes[lVar1].next;
        pSVar2 = pSVar4;
        goto joined_r0x001383d6;
      }
    }
    if ((str != (SQChar *)0x0) ||
       (text_begin = pSVar4 + 1, pSVar2 = text_begin, text_begin == text_end)) {
      if (str == (SQChar *)0x0) {
        SVar3 = 0;
      }
      else {
        if (out_begin != (SQChar **)0x0) {
          *out_begin = pSVar4;
        }
        SVar3 = 1;
        if (out_end != (SQChar **)0x0) {
          *out_end = str;
        }
      }
      return SVar3;
    }
  } while( true );
}

Assistant:

SQBool sqstd_rex_searchrange(SQRex* exp,const SQChar* text_begin,const SQChar* text_end,const SQChar** out_begin, const SQChar** out_end)
{
    const SQChar *cur = NULL;
    SQInteger node = exp->_first;
    if(text_begin >= text_end) return SQFalse;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
        cur = text_begin;
        while(node != -1) {
            exp->_currsubexp = 0;
            cur = sqstd_rex_matchnode(exp,&exp->_nodes[node],cur,NULL);
            if(!cur)
                break;
            node = exp->_nodes[node].next;
        }
        text_begin++;
    } while(cur == NULL && text_begin != text_end);

    if(cur == NULL)
        return SQFalse;

    --text_begin;

    if(out_begin) *out_begin = text_begin;
    if(out_end) *out_end = cur;
    return SQTrue;
}